

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

int __thiscall QDate::dayOfYear(QDate *this)

{
  int year;
  optional<long_long> oVar1;
  YearMonthDay YVar2;
  
  if (this->jd + 0xb69eeff91fU < 0x16d3e147974) {
    YVar2 = QGregorianCalendar::partsFromJulian(this->jd);
    year = 0;
    if (YVar2.month != -0x80000000) {
      year = YVar2.year;
    }
    oVar1 = QGregorianCalendar::julianFromParts(year,1,1);
    if (((undefined1  [16])
         oVar1.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    {
      return ((int)this->jd -
             oVar1.super__Optional_base<long_long,_true,_true>._M_payload.
             super__Optional_payload_base<long_long>._M_payload._0_4_) + 1;
    }
  }
  return 0;
}

Assistant:

int QDate::dayOfYear() const
{
    if (isValid()) {
        if (const auto first = QGregorianCalendar::julianFromParts(year(), 1, 1))
            return jd - *first + 1;
    }
    return 0;
}